

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSemantic.cpp
# Opt level: O0

void __thiscall UnitTest_semantic14::Run(UnitTest_semantic14 *this)

{
  UnitTestBase *this_00;
  Terminator *pTVar1;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_RDI;
  Terminator *a2;
  ReturnStatement *ret;
  Terminator *f;
  Terminator *a;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> ast;
  string *in_stack_fffffffffffffdd8;
  allocator *paVar2;
  FindName *in_stack_fffffffffffffde0;
  allocator *this_01;
  allocator *in_stack_fffffffffffffe08;
  string *in_stack_fffffffffffffe18;
  allocator *error;
  allocator local_1b9;
  string local_1b8 [39];
  allocator local_191;
  string local_190 [64];
  Terminator *local_150;
  ReturnStatement *local_140;
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [64];
  Terminator *local_a0;
  allocator local_91;
  string local_90 [64];
  UnitTestBase *local_50;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,
             "function test()     local a = 1     a = f()     return function() return a end end",
             &local_31);
  anon_unknown.dwarf_fc1b::Semantic(in_stack_fffffffffffffe18);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  paVar2 = &local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"a",paVar2);
  FindName::FindName(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  this_00 = (UnitTestBase *)ASTFind<luna::Terminator,FindName>(in_RDI,(FindName *)paVar2);
  FindName::~FindName((FindName *)0x1aa387);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  error = &local_e1;
  local_50 = this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"f",error);
  FindName::FindName(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  pTVar1 = ASTFind<luna::Terminator,FindName>(in_RDI,(FindName *)paVar2);
  FindName::~FindName((FindName *)0x1aa41b);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  local_a0 = pTVar1;
  if (*(LexicalScoping *)
       ((long)&(local_50->errors_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 4) != LexicalScoping_Local) {
    in_stack_fffffffffffffe08 = &local_109;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_108,"\'a->scoping_ == luna::LexicalScoping_Local\'",in_stack_fffffffffffffe08);
    UnitTestBase::Error(this_00,(string *)error);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
  }
  if (local_a0->scoping_ != LexicalScoping_Global) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_130,"\'f->scoping_ == luna::LexicalScoping_Global\'",&local_131);
    UnitTestBase::Error(this_00,(string *)error);
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
  }
  local_140 = ASTFind<luna::ReturnStatement,AcceptAST>
                        ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                         pTVar1,(AcceptAST *)in_stack_fffffffffffffe08);
  this_01 = &local_191;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"a",this_01);
  FindName::FindName(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  pTVar1 = ASTFind<luna::Terminator,FindName>(in_RDI,(FindName *)paVar2);
  FindName::~FindName((FindName *)0x1aa784);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  local_150 = pTVar1;
  if (pTVar1->scoping_ != LexicalScoping_Upvalue) {
    paVar2 = &local_1b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_1b8,"\'a2->scoping_ == luna::LexicalScoping_Upvalue\'",paVar2);
    UnitTestBase::Error(this_00,(string *)error);
    std::__cxx11::string::~string(local_1b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  }
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)this_01);
  return;
}

Assistant:

TEST_CASE(semantic14)
{
    auto ast = Semantic("function test() "
                        "    local a = 1 "
                        "    a = f() "
                        "    return function() return a end "
                        "end");

    auto a = ASTFind<luna::Terminator>(ast, FindName("a"));
    auto f = ASTFind<luna::Terminator>(ast, FindName("f"));
    EXPECT_TRUE(a->scoping_ == luna::LexicalScoping_Local);
    EXPECT_TRUE(f->scoping_ == luna::LexicalScoping_Global);

    auto ret = ASTFind<luna::ReturnStatement>(ast, AcceptAST());
    auto a2 = ASTFind<luna::Terminator>(ret->exp_list_, FindName("a"));
    EXPECT_TRUE(a2->scoping_ == luna::LexicalScoping_Upvalue);
}